

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O1

lws * lws_wsi_mux_move_child_to_tail(lws **wsi2)

{
  lws *plVar1;
  lws *plVar2;
  
  plVar1 = *wsi2;
  do {
    plVar2 = plVar1;
    if (plVar2 == (lws *)0x0) {
      plVar2 = (lws *)0x0;
      goto LAB_0011771f;
    }
    plVar1 = (plVar2->mux).sibling_list;
  } while (plVar1 != (lws *)0x0);
  _lws_log(0x10,"w=%p, *wsi2 = %p\n",plVar2);
  if (plVar2 != *wsi2) {
    (plVar2->mux).sibling_list = *wsi2;
    *wsi2 = ((*wsi2)->mux).sibling_list;
    (((plVar2->mux).sibling_list)->mux).sibling_list = (lws *)0x0;
    plVar2 = (plVar2->mux).sibling_list;
  }
LAB_0011771f:
  if (plVar2 != (lws *)0x0) {
    (plVar2->mux).requested_POLLOUT = '\0';
  }
  return plVar2;
}

Assistant:

struct lws *
lws_wsi_mux_move_child_to_tail(struct lws **wsi2)
{
	struct lws *w = *wsi2;

	while (w) {
		if (!w->mux.sibling_list) { /* w is the current last */
			lwsl_debug("w=%p, *wsi2 = %p\n", w, *wsi2);

			if (w == *wsi2) /* we are already last */
				break;

			/* last points to us as new last */
			w->mux.sibling_list = *wsi2;

			/* guy pointing to us until now points to
			 * our old next */
			*wsi2 = (*wsi2)->mux.sibling_list;

			/* we point to nothing because we are last */
			w->mux.sibling_list->mux.sibling_list = NULL;

			/* w becomes us */
			w = w->mux.sibling_list;
			break;
		}
		w = w->mux.sibling_list;
	}

	/* clear the waiting for POLLOUT on the guy that was chosen */

	if (w)
		w->mux.requested_POLLOUT = 0;

	return w;
}